

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O3

bool CB_ALGS::know_all_cost_example(label *ld)

{
  float fVar1;
  cb_class *pcVar2;
  cb_class *pcVar3;
  bool bVar4;
  cb_class *pcVar5;
  
  pcVar2 = (ld->costs)._begin;
  pcVar3 = (ld->costs)._end;
  if ((ulong)((long)pcVar3 - (long)pcVar2) < 0x11) {
    bVar4 = false;
  }
  else {
    if (pcVar2 == pcVar3) {
      return true;
    }
    do {
      pcVar5 = pcVar2 + 1;
      fVar1 = pcVar2->cost;
      bVar4 = (bool)(-(fVar1 != 3.4028235e+38) & 1);
      if ((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) {
        return bVar4;
      }
      pcVar2 = pcVar5;
    } while (pcVar5 != pcVar3);
  }
  return bVar4;
}

Assistant:

inline size_t size() const { return _end - _begin; }